

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::ZoneStackBase::_prepareBlock
          (ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  Block *this_00;
  bool bVar1;
  Block *pBVar2;
  long in_RDX;
  uint in_ESI;
  ZoneStackBase *in_RDI;
  Block *block;
  Block *prev;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  ZoneAllocator *in_stack_ffffffffffffffd0;
  Error local_4;
  
  bVar1 = isInitialized(in_RDI);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  this_00 = in_RDI->_block[in_ESI];
  bVar1 = Block::empty(this_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  pBVar2 = ZoneAllocator::allocT<asmjit::_abi_1_10::ZoneStackBase::Block>
                     (in_stack_ffffffffffffffd0,(size_t)in_RDI);
  if (pBVar2 == (Block *)0x0) {
    local_4 = DebugUtils::errored(1);
  }
  else {
    pBVar2->_link[in_ESI] = (Block *)0x0;
    pBVar2->_link[(in_ESI != 0 ^ 0xffU) & 1] = this_00;
    pBVar2->_start = (void *)((long)pBVar2->_link + in_RDX);
    pBVar2->_end = (void *)((long)pBVar2->_link + in_RDX);
    this_00->_link[in_ESI] = pBVar2;
    in_RDI->_block[in_ESI] = pBVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}